

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_id_func.h
# Opt level: O2

void __thiscall TinyIntIDFunc<1>::TinyIntIDFunc(TinyIntIDFunc<1> *this,int preimage)

{
  this->preimage_ = preimage;
  ArrayIDFunc<unsigned_long>::ArrayIDFunc(&this->data_,(preimage + 0x3f) / 0x40);
  return;
}

Assistant:

explicit TinyIntIDFunc(int preimage)
        : preimage_(preimage)
        , data_((preimage + entry_count_per_uint64 - 1) / entry_count_per_uint64)
    {
    }